

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeRollback(Btree *p,int tripCode)

{
  BtShared *pBt;
  int iVar1;
  Pgno PVar2;
  int extraout_EAX;
  MemPage *in_RAX;
  MemPage *pPage1;
  
  pBt = p->pBt;
  pPage1 = in_RAX;
  sqlite3BtreeEnter(p);
  if (tripCode == 0) {
    tripCode = saveAllCursors(pBt,0,(BtCursor *)0x0);
    if (tripCode == 0) goto LAB_00137f6a;
  }
  sqlite3BtreeTripAllCursors(p,tripCode);
LAB_00137f6a:
  if (p->inTrans == '\x02') {
    sqlite3PagerRollback(pBt->pPager);
    iVar1 = btreeGetPage(pBt,1,&pPage1,0,0);
    if (iVar1 == 0) {
      PVar2 = sqlite3Get4byte(pPage1->aData + 0x1c);
      if (PVar2 == 0) {
        PVar2 = pBt->pPager->dbSize;
      }
      pBt->nPage = PVar2;
      releasePage(pPage1);
    }
    pBt->inTransaction = '\x01';
    btreeClearHasContent(pBt);
  }
  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    sqlite3BtreeTripAllCursors(p, tripCode);
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0, 0)==SQLITE_OK ){
      int nPage = get4byte(28+(u8*)pPage1->aData);
      testcase( nPage==0 );
      if( nPage==0 ) sqlite3PagerPagecount(pBt->pPager, &nPage);
      testcase( pBt->nPage!=nPage );
      pBt->nPage = nPage;
      releasePage(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}